

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeFlushCase::testBufferUpload
          (MapBufferRangeFlushCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar3;
  deUint64 dVar4;
  void *dst;
  Exception *this_00;
  TestError *this_01;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  allocator<char> local_81;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  long local_60;
  deUint64 local_58;
  string local_50;
  
  local_70 = bufferSize / 2;
  local_68 = (long)bufferSize;
  local_60 = (long)(bufferSize / 4);
  local_74 = bufferSize;
  if (3 < this->m_unmapFailures) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38,2,(long)bufferSize % 4 & 0xffffffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Unmapping failures exceeded limit",&local_81);
    tcu::TestError::TestError(this_01,&local_50);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_80 = CONCAT44(extraout_var,iVar2);
  iVar2 = local_70;
  if (this->m_fullUpload != false) {
    iVar2 = local_74;
  }
  if ((this->m_fullUpload != true) || (iVar5 = local_74, this->m_flushPartial == true)) {
    iVar5 = local_70;
  }
  result->writtenSize = iVar5;
  (**(code **)(local_80 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                    .m_bufferID);
  if (this->m_useUnusedUnspecifiedBuffer == true) {
    dVar3 = deGetMicroseconds();
    (**(code **)(local_80 + 0x150))
              (0x8892,local_68,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_bufferUsage);
  }
  else {
    if (this->m_useUnusedSpecifiedBuffer != true) {
      dVar4 = 0;
      goto LAB_0117ae33;
    }
    dVar3 = deGetMicroseconds();
    (**(code **)(local_80 + 0x150))
              (0x8892,local_68,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_bufferUsage);
  }
  dVar4 = deGetMicroseconds();
  dVar4 = dVar4 - dVar3;
LAB_0117ae33:
  (result->duration).allocDuration = dVar4;
  dVar4 = deGetMicroseconds();
  lVar8 = local_60;
  if (this->m_fullUpload != false) {
    lVar8 = 0;
  }
  lVar7 = (long)iVar2;
  dst = (void *)(**(code **)(local_80 + 0xd00))(0x8892,lVar8,lVar7,this->m_mapFlags);
  dVar3 = deGetMicroseconds();
  if (dst == (void *)0x0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"MapBufferRange returned NULL",&local_81);
    tcu::Exception::Exception(this_00,&local_50);
    __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
  }
  (result->duration).mapDuration = dVar3 - dVar4;
  if (this->m_flushPartial == false) {
    dVar4 = medianTimeMemcpy(dst,(this->
                                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
  }
  else {
    dVar4 = medianTimeMemcpy((void *)((long)dst + local_60),
                             (this->
                             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                             ).m_zeroData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,result->writtenSize);
  }
  (result->duration).writeDuration = dVar4;
  local_58 = deGetMicroseconds();
  if (this->m_flushPartial == true) {
    puVar9 = (undefined8 *)(local_80 + 0x658);
    lVar8 = (long)(iVar2 / 4);
    lVar7 = (long)(iVar2 / 2);
  }
  else if (this->m_flushInParts == false) {
    puVar9 = (undefined8 *)(local_80 + 0x658);
    lVar8 = 0;
  }
  else {
    iVar5 = iVar2 / 3;
    local_6c = iVar2 / 2;
    iVar6 = (iVar2 * 2) / 4;
    (**(code **)(local_80 + 0x658))(0x8892,(long)iVar5,(long)(local_6c - iVar5));
    puVar9 = (undefined8 *)(local_80 + 0x658);
    (*(code *)*puVar9)(0x8892,0,(long)iVar5);
    (*(code *)*puVar9)(0x8892,(long)iVar6,(long)(iVar2 - iVar6));
    lVar8 = (long)local_6c;
    lVar7 = (long)(iVar6 - local_6c);
  }
  (*(code *)*puVar9)(0x8892,lVar8,lVar7);
  dVar4 = deGetMicroseconds();
  (result->duration).flushDuration = dVar4 - local_58;
  dVar4 = deGetMicroseconds();
  cVar1 = (**(code **)(local_80 + 0x1670))(0x8892);
  dVar3 = deGetMicroseconds();
  if (cVar1 == '\0') {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_01e4a2b8;
    __cxa_throw(puVar9,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                std::exception::~exception);
  }
  (result->duration).unmapDuration = dVar3 - dVar4;
  dVar4 = (dVar3 - dVar4) + (result->duration).mapDuration + (result->duration).writeDuration +
          (result->duration).flushDuration + (result->duration).allocDuration;
  (result->duration).totalDuration = dVar4;
  (result->duration).fitResponseDuration = dVar4;
  return;
}

Assistant:

void MapBufferRangeFlushCase::testBufferUpload (UploadSampleResult<MapBufferRangeFlushDuration>& result, int bufferSize)
{
	const int unmapFailureThreshold = 4;

	for (; m_unmapFailures < unmapFailureThreshold; ++m_unmapFailures)
	{
		try
		{
			attemptBufferMap(result, bufferSize);
			return;
		}
		catch (UnmapFailureError&)
		{
		}
	}

	throw tcu::TestError("Unmapping failures exceeded limit");
}